

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

csc * csc_done(csc *C,void *w,void *x,c_int ok)

{
  free(w);
  free(x);
  if (ok == 0) {
    csc_spfree(C);
    C = (csc *)0x0;
  }
  return C;
}

Assistant:

csc* csc_done(csc *C, void *w, void *x, c_int ok) {
  c_free(w);                   /* free workspace */
  c_free(x);
  if (ok) return C;
  else {
    csc_spfree(C);
    return OSQP_NULL;
  }
}